

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_div_int(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi_uint local_20;
  mbedtls_mpi local_18;
  
  local_20 = -b;
  if (0 < b) {
    local_20 = b;
  }
  local_18.p = &local_20;
  local_18.s = (uint)(b >> 0x3f) | 1;
  local_18.n = 1;
  iVar1 = mbedtls_mpi_div_mpi(Q,R,A,&local_18);
  return iVar1;
}

Assistant:

int mbedtls_mpi_div_int( mbedtls_mpi *Q, mbedtls_mpi *R,
                         const mbedtls_mpi *A,
                         mbedtls_mpi_sint b )
{
    mbedtls_mpi _B;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET( A != NULL );

    p[0] = ( b < 0 ) ? -b : b;
    _B.s = ( b < 0 ) ? -1 : 1;
    _B.n = 1;
    _B.p = p;

    return( mbedtls_mpi_div_mpi( Q, R, A, &_B ) );
}